

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

void sq_setdebughook(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQObjectPtr *pSVar5;
  
  pSVar5 = SQVM::GetUp(v,-1);
  SVar2 = (pSVar5->super_SQObject)._type;
  if (((SVar2 != OT_NULL) && (SVar2 != OT_NATIVECLOSURE)) && (SVar2 != OT_CLOSURE)) {
    return;
  }
  SVar3 = (v->_debughook_closure).super_SQObject._type;
  pSVar4 = (v->_debughook_closure).super_SQObject._unVal.pTable;
  (v->_debughook_closure).super_SQObject._unVal = (pSVar5->super_SQObject)._unVal;
  (v->_debughook_closure).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(((v->_debughook_closure).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  v->_debughook_native = (SQDEBUGHOOK)0x0;
  v->_debughook = SVar2 != OT_NULL;
  SQVM::Pop(v);
  return;
}

Assistant:

void sq_setdebughook(HSQUIRRELVM v)
{
    SQObject o = stack_get(v,-1);
    if(sq_isclosure(o) || sq_isnativeclosure(o) || sq_isnull(o)) {
        v->_debughook_closure = o;
        v->_debughook_native = NULL;
        v->_debughook = !sq_isnull(o);
        v->Pop();
    }
}